

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O0

void * dlsym(void *handle,char *name)

{
  void *symbol;
  libwrap *wrap;
  char *name_local;
  void *handle_local;
  
  if ((handle < wrapped_libs) ||
     (symbol = handle, (void *)((long)&wrapped_libs[2].handle + 7) < handle)) {
    symbol = (void *)0x0;
  }
  if (symbol == (void *)0x0) {
    handle_local = dlwrap_real_dlsym(handle,name);
  }
  else {
    handle_local = wrapped_dlsym(*(char **)((long)symbol + 8),name);
    if (handle_local == (void *)0x0) {
      handle_local = dlwrap_real_dlsym(*(void **)((long)symbol + 0x10),name);
    }
  }
  return handle_local;
}

Assistant:

void *
dlsym(void *handle, const char *name)
{
    struct libwrap *wrap = handle;

    /* Make sure that handle is actually one of our wrapped libs. */
    if (wrap < wrapped_libs ||
        wrap >= wrapped_libs + ARRAY_SIZE(wrapped_libs)) {
        wrap = NULL;
    }

    /* Failing that, anything specifically requested from the
     * libfips library should be redirected to a real GL
     * library. */

    if (wrap) {
        void *symbol = wrapped_dlsym(wrap->symbol_prefix, name);
        if (symbol)
            return symbol;
        else
            return dlwrap_real_dlsym(wrap->handle, name);
    }

    /* And anything else is some unrelated dlsym. Just pass it
     * through.  (This also covers the cases of lookups with
     * special handles such as RTLD_DEFAULT or RTLD_NEXT.)
     */
    return dlwrap_real_dlsym(handle, name);
}